

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall rw::World::addClump(World *this,Clump *clump)

{
  LLLink *pLVar1;
  void *pvVar2;
  LLLink *pLVar3;
  
  clump->world = this;
  pLVar3 = (this->clumps).link.next;
  (clump->inWorld).next = pLVar3;
  (clump->inWorld).prev = &(this->clumps).link;
  pLVar3->prev = &clump->inWorld;
  (this->clumps).link.next = &clump->inWorld;
  pLVar3 = (clump->atomics).link.next;
  while (pLVar3 != &(clump->atomics).link) {
    pLVar1 = pLVar3->next;
    addAtomic(this,(Atomic *)&pLVar3[-6].prev);
    pLVar3 = pLVar1;
  }
  pLVar3 = (clump->lights).link.next;
  while (pLVar3 != &(clump->lights).link) {
    pLVar1 = pLVar3->next;
    addLight(this,(Light *)&pLVar3[-6].prev);
    pLVar3 = pLVar1;
  }
  pLVar3 = (clump->cameras).link.next;
  while (pLVar3 != &(clump->cameras).link) {
    pLVar1 = pLVar3->next;
    addCamera(this,(Camera *)&pLVar3[-0x23].prev);
    pLVar3 = pLVar1;
  }
  pvVar2 = (clump->object).parent;
  if (pvVar2 != (void *)0x0) {
    Matrix::optimize((Matrix *)((long)pvVar2 + 0x30),(Tolerance *)0x0);
    Frame::updateObjects((Frame *)(clump->object).parent);
    return;
  }
  return;
}

Assistant:

void
World::addClump(Clump *clump)
{
	assert(clump->world == nil);
	clump->world = this;
	this->clumps.add(&clump->inWorld);
	FORLIST(lnk, clump->atomics)
		this->addAtomic(Atomic::fromClump(lnk));
	FORLIST(lnk, clump->lights)
		this->addLight(Light::fromClump(lnk));
	FORLIST(lnk, clump->cameras)
		this->addCamera(Camera::fromClump(lnk));

	if(clump->getFrame()){
		clump->getFrame()->matrix.optimize();
		clump->getFrame()->updateObjects();
	}
}